

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  uchar *in_RDX;
  long in_RSI;
  secp256k1_ge p;
  secp256k1_fe t;
  secp256k1_fe u;
  char *in_stack_ffffffffffffff38;
  secp256k1_callback *in_stack_ffffffffffffff40;
  secp256k1_fe *in_stack_ffffffffffffff60;
  secp256k1_fe *in_stack_ffffffffffffff68;
  secp256k1_ge *in_stack_ffffffffffffff70;
  secp256k1_ge *in_stack_ffffffffffffff78;
  secp256k1_pubkey *in_stack_ffffffffffffff80;
  secp256k1_fe local_70;
  secp256k1_fe local_48;
  uchar *local_20;
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 0;
  }
  else if (in_RDX == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 0;
  }
  else {
    local_20 = in_RDX;
    secp256k1_fe_impl_set_b32_mod(&local_48,in_RDX);
    secp256k1_fe_impl_set_b32_mod(&local_70,local_20 + 0x20);
    secp256k1_fe_impl_normalize_var(&local_70);
    secp256k1_ellswift_swiftec_var
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    secp256k1_pubkey_save(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}